

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::visitStore(wasm::Store__(void *this,Store *curr)

{
  Store SVar1;
  long *plVar2;
  IString result;
  IString result_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer ppCVar7;
  int iVar8;
  Ref RVar9;
  Ref RVar10;
  Ref obj;
  size_t *psVar11;
  Value *this_00;
  undefined8 *puVar12;
  long lVar13;
  char *pcVar14;
  void *pvVar15;
  uint uVar16;
  Store *pSVar17;
  Ref in_R8;
  byte bVar18;
  IString possible;
  IString possible_00;
  IString nextResult;
  IString key;
  IString op;
  Name NVar19;
  Name NVar20;
  undefined1 local_2d0 [8];
  Store fakeStore;
  pointer local_2c0 [4];
  undefined1 *local_2a0;
  bool *local_298;
  undefined1 local_148 [8];
  ScopedTemp value;
  LocalGet getValue;
  long local_100;
  long local_f8;
  undefined1 local_f0 [8];
  LocalGet getPtr;
  Ref ret;
  char *local_c8;
  char *local_c0;
  FindAll<wasm::Call> local_b0;
  FindAll<wasm::CallIndirect> local_98;
  FindAll<wasm::CallIndirect> local_80;
  FindAll<wasm::MemoryGrow> local_68;
  pointer local_50;
  pointer local_48;
  char *pcStack_40;
  bool local_31;
  
  bVar18 = 0;
  plVar2 = *(long **)(*(long *)((long)this + 0x20) + 0x78);
  if (((plVar2 != *(long **)(*(long *)((long)this + 0x20) + 0x80)) &&
      (lVar13 = *plVar2, *(ulong *)(lVar13 + 0x38) < *(ulong *)(lVar13 + 0x40))) &&
     (*(long *)(curr + 8) != 1)) {
    FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)local_2d0,*(Expression **)(curr + 0x30));
    local_48 = (pointer)local_2d0;
    local_50 = _fakeStore;
    if ((local_2d0 == (undefined1  [8])_fakeStore) &&
       (FindAll<wasm::Call>::FindAll(&local_b0,*(Expression **)(curr + 0x38)),
       local_b0.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
       super__Vector_impl_data._M_start ==
       local_b0.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      FindAll<wasm::CallIndirect>::FindAll(&local_98,*(Expression **)(curr + 0x30));
      if (local_98.list.
          super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_98.list.
          super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        FindAll<wasm::CallIndirect>::FindAll(&local_80,*(Expression **)(curr + 0x38));
        if (local_80.list.
            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_80.list.
            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          FindAll<wasm::MemoryGrow>::FindAll(&local_68,*(Expression **)(curr + 0x30));
          if (local_68.list.
              super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_68.list.
              super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            FindAll<wasm::MemoryGrow>::FindAll
                      ((FindAll<wasm::MemoryGrow> *)&getValue.index,*(Expression **)(curr + 0x38));
            local_31 = getValue._16_8_ != local_100;
            bVar3 = true;
            bVar4 = true;
            bVar5 = true;
            bVar6 = true;
            goto LAB_00146ef1;
          }
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        bVar5 = true;
      }
      else {
        bVar4 = false;
        bVar5 = false;
      }
      bVar3 = false;
      bVar6 = true;
      local_31 = true;
    }
    else {
      local_31 = true;
      bVar3 = false;
      bVar4 = false;
      bVar5 = false;
      bVar6 = false;
    }
LAB_00146ef1:
    if ((bVar3) && (getValue._16_8_ != 0)) {
      operator_delete((void *)getValue._16_8_,local_f8 - getValue._16_8_);
    }
    if ((bVar4) &&
       (local_68.list.super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_68.list.
                      super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.list.
                            super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.list.
                            super__Vector_base<wasm::MemoryGrow_*,_std::allocator<wasm::MemoryGrow_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ppCVar7 = local_48;
    if ((bVar5) &&
       (local_80.list.
        super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_80.list.
                      super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.list.
                            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.list.
                            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar3 = local_31;
    if ((bVar6) &&
       (local_98.list.
        super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_98.list.
                      super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.list.
                            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.list.
                            super__Vector_base<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((ppCVar7 == local_50) &&
       (local_b0.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_b0.list.super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b0.list.
                            super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.list.
                            super__Vector_base<wasm::Call_*,_std::allocator<wasm::Call_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2d0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2d0,(long)local_2c0[0] - (long)local_2d0);
    }
    if (bVar3 != false) {
      possible.str._M_str = _finalize;
      possible.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (&getPtr.index,(Type)0x2,*this,*(Function **)((long)this + 0x18),possible);
      result_00.str._M_str = local_c0;
      result_00.str._M_len = (size_t)local_c8;
      RVar9 = visitAndAssign(wasm::Expression*,wasm::IString_
                        (this,*(Expression **)(curr + 0x30),result_00);
      local_50 = (pointer)local_c8;
      possible_00.str._M_str = _finalize;
      possible_00.str._M_len = NO_RESULT;
      ScopedTemp::ScopedTemp(wasm::Type,wasm::Wasm2JSBuilder*,wasm::Function*,wasm::IString_
                (local_148,(Type)*(uintptr_t *)(*(long *)(curr + 0x38) + 8),*this,
                 *(Function **)((long)this + 0x18),possible_00);
      result.str._M_str = (char *)value.temp.str._M_len;
      result.str._M_len = value.type.id;
      RVar10 = visitAndAssign(wasm::Expression*,wasm::IString_
                         (this,*(Expression **)(curr + 0x38),result);
      if (RVar9.inst != (Value *)0x0) {
        RVar10 = cashew::ValueBuilder::makeSeq(RVar9,RVar10);
      }
      local_f0[0] = 8;
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._id = InvalidId;
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._1_7_ = 0;
      NVar19.super_IString.str._M_str = (char *)local_50;
      NVar19.super_IString.str._M_len = *(size_t *)((long)this + 0x18);
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id._0_4_ =
           ::wasm::Function::getLocalIndex(NVar19);
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._id = IfId;
      getPtr.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._1_7_ = 0;
      value.needFree = true;
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._id = InvalidId;
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._1_7_ = 0;
      NVar20.super_IString.str._M_str = (char *)value.type.id;
      NVar20.super_IString.str._M_len = *(size_t *)((long)this + 0x18);
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression.type.id._0_4_ =
           ::wasm::Function::getLocalIndex(NVar20);
      local_298 = &value.needFree;
      getValue.super_SpecificExpression<(wasm::Expression::Id)8>.super_Expression._0_8_ =
           *(undefined8 *)(*(long *)(curr + 0x38) + 8);
      pSVar17 = (Store *)local_2d0;
      for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
        *(undefined8 *)pSVar17 = *(undefined8 *)curr;
        curr = curr + (ulong)bVar18 * -0x10 + 8;
        pSVar17 = pSVar17 + (ulong)bVar18 * -0x10 + 8;
      }
      local_2a0 = local_f0;
      RVar9 = Store__(this,(Store *)local_2d0);
      if (RVar10.inst != (Value *)0x0) {
        RVar9 = cashew::ValueBuilder::makeSeq(RVar10,RVar9);
      }
      processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)local_148);
      processExpression::ExpressionProcessor::ScopedTemp::~ScopedTemp((ScopedTemp *)&getPtr.index);
      return (Ref)RVar9.inst;
    }
  }
  if ((*(ulong *)(curr + 0x20) != 0) && (*(ulong *)(curr + 0x20) != (ulong)(byte)curr[0x10])) {
    __assert_fail("curr->align == 0 || curr->align == curr->bytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0x5f8,
                  "Ref wasm::Wasm2JSBuilder::processExpression(Expression *, Module *, Function *, bool)::ExpressionProcessor::visitStore(Store *)"
                 );
  }
  RVar9 = makePointer(wasm::Expression*,wasm::Address_
                    (this,*(Expression **)(curr + 0x30),(Address)*(address64_t *)(curr + 0x18));
  nextResult.str._M_str = cashew::RSHIFT;
  nextResult.str._M_len = EXPRESSION_RESULT;
  pcVar14 = cashew::RSHIFT;
  RVar10 = visit(wasm::Expression*,wasm::IString_(this,*(Expression **)(curr + 0x38),nextResult);
  getPtr.index = 0;
  getPtr._20_4_ = 0;
  if (6 < *(ulong *)(curr + 0x40)) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  iVar8 = (int)*(ulong *)(curr + 0x40);
  if (iVar8 == 5) {
    local_48 = (pointer)cashew::HEAPF64;
    pcStack_40 = _VTT;
    pvVar15 = (void *)0x18;
    obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (obj.inst)->type = Null;
    cashew::Value::free(obj.inst,pvVar15);
    (obj.inst)->type = String;
    ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
    ((obj.inst)->field_1).str.str._M_str = pcStack_40;
    iVar8 = 3;
  }
  else {
    if (iVar8 == 4) {
      psVar11 = &cashew::HEAPF32;
    }
    else {
      if (iVar8 != 2) {
        Fatal::Fatal((Fatal *)local_2d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2c0,"Unhandled type in store: ",0x19);
        Fatal::operator<<((Fatal *)local_2d0,(Type *)(curr + 0x40));
        Fatal::~Fatal((Fatal *)local_2d0);
      }
      SVar1 = curr[0x10];
      if (SVar1 != (Store)0x4) {
        if (SVar1 == (Store)0x2) {
          local_48 = (pointer)cashew::HEAP16;
          pcStack_40 = __stringstream;
          pvVar15 = (void *)0x18;
          obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          (obj.inst)->type = Null;
          cashew::Value::free(obj.inst,pvVar15);
          (obj.inst)->type = String;
          ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
          ((obj.inst)->field_1).str.str._M_str = pcStack_40;
          iVar8 = 1;
        }
        else {
          if (SVar1 != (Store)0x1) {
            abort();
          }
          local_48 = (pointer)cashew::HEAP8;
          pcStack_40 = cashew::HEAPF64;
          pvVar15 = (void *)0x18;
          obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
          (obj.inst)->type = Null;
          cashew::Value::free(obj.inst,pvVar15);
          (obj.inst)->type = String;
          ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
          ((obj.inst)->field_1).str.str._M_str = pcStack_40;
          iVar8 = 0;
        }
        goto LAB_00147305;
      }
      psVar11 = &cashew::HEAP32;
    }
    local_48 = (pointer)*psVar11;
    pcStack_40 = (char *)psVar11[1];
    pvVar15 = (void *)0x18;
    obj.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (obj.inst)->type = Null;
    cashew::Value::free(obj.inst,pvVar15);
    (obj.inst)->type = String;
    ((obj.inst)->field_1).str.str._M_len = (size_t)local_48;
    ((obj.inst)->field_1).str.str._M_str = pcStack_40;
    iVar8 = 2;
  }
LAB_00147305:
  RVar9 = cashew::ValueBuilder::makePtrShift(RVar9,iVar8);
  getPtr._16_8_ = cashew::ValueBuilder::makeSub(obj,RVar9);
  if (curr[0x28] == (Store)0x1) {
    local_48 = (pointer)cashew::ATOMICS;
    pcStack_40 = _makeJsCoercedZero;
    pvVar15 = (void *)0x18;
    this_00 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_00->type = Null;
    cashew::Value::free(this_00,pvVar15);
    this_00->type = String;
    (this_00->field_1).str.str._M_len = (size_t)local_48;
    (this_00->field_1).str.str._M_str = pcStack_40;
    key.str._M_str = pcVar14;
    key.str._M_len = _add;
    RVar9 = cashew::ValueBuilder::makeDot((ValueBuilder *)this_00,cashew::STORE,key);
    RVar9 = cashew::ValueBuilder::makeCall(RVar9);
    uVar16 = (int)&getPtr + 0x10;
    puVar12 = (undefined8 *)cashew::Ref::operator[](uVar16);
    cashew::ValueBuilder::appendToCall(RVar9,(Value *)*puVar12);
    puVar12 = (undefined8 *)cashew::Ref::operator[](uVar16);
    cashew::ValueBuilder::appendToCall(RVar9,(Value *)*puVar12);
    cashew::ValueBuilder::appendToCall(RVar9,RVar10);
  }
  else {
    op.str._M_str = (char *)RVar10.inst;
    op.str._M_len = BLOCK;
    RVar9 = cashew::ValueBuilder::makeBinary((ValueBuilder *)getPtr._16_8_,cashew::SET,op,in_R8);
  }
  return (Ref)RVar9.inst;
}

Assistant:

Ref visitStore(Store* curr) {
      if (!module->memories.empty() &&
          module->memories[0]->initial < module->memories[0]->max &&
          curr->type != Type::unreachable) {
        // In JS, if memory grows then it is dangerous to write
        //  HEAP[f()] = ..
        // or
        //  HEAP[..] = f()
        // since if the call swaps HEAP (in a growth operation) then
        // we will not actually write to the new version (since the
        // semantics of JS mean we already looked at HEAP and have
        // decided where to assign to).
        if (!FindAll<Call>(curr->ptr).list.empty() ||
            !FindAll<Call>(curr->value).list.empty() ||
            !FindAll<CallIndirect>(curr->ptr).list.empty() ||
            !FindAll<CallIndirect>(curr->value).list.empty() ||
            !FindAll<MemoryGrow>(curr->ptr).list.empty() ||
            !FindAll<MemoryGrow>(curr->value).list.empty()) {
          Ref ret;
          ScopedTemp ptr(Type::i32, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->ptr, ptr));
          ScopedTemp value(curr->value->type, parent, func);
          sequenceAppend(ret, visitAndAssign(curr->value, value));
          LocalGet getPtr;
          getPtr.index = func->getLocalIndex(ptr.getName());
          getPtr.type = Type::i32;
          LocalGet getValue;
          getValue.index = func->getLocalIndex(value.getName());
          getValue.type = curr->value->type;
          Store fakeStore = *curr;
          fakeStore.ptr = &getPtr;
          fakeStore.value = &getValue;
          sequenceAppend(ret, visitStore(&fakeStore));
          return ret;
        }
      }
      // FIXME if memory growth, store ptr cannot contain a function call
      //       also other stores to memory, check them, all makeSub's
      // Unaligned loads and stores must have been fixed up already.
      assert(curr->align == 0 || curr->align == curr->bytes);
      // normal store
      Ref ptr = makePointer(curr->ptr, curr->offset);
      Ref value = visit(curr->value, EXPRESSION_RESULT);
      Ref ret;
      switch (curr->valueType.getBasic()) {
        case Type::i32: {
          switch (curr->bytes) {
            case 1:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP8),
                                          ValueBuilder::makePtrShift(ptr, 0));
              break;
            case 2:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP16),
                                          ValueBuilder::makePtrShift(ptr, 1));
              break;
            case 4:
              ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAP32),
                                          ValueBuilder::makePtrShift(ptr, 2));
              break;
            default:
              abort();
          }
          break;
        }
        case Type::f32:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF32),
                                      ValueBuilder::makePtrShift(ptr, 2));
          break;
        case Type::f64:
          ret = ValueBuilder::makeSub(ValueBuilder::makeName(HEAPF64),
                                      ValueBuilder::makePtrShift(ptr, 3));
          break;
        default: {
          Fatal() << "Unhandled type in store: " << curr->valueType;
        }
      }
      if (curr->isAtomic) {
        Ref call = ValueBuilder::makeCall(
          ValueBuilder::makeDot(ValueBuilder::makeName(ATOMICS), STORE));
        ValueBuilder::appendToCall(call, ret[1]);
        ValueBuilder::appendToCall(call, ret[2]);
        ValueBuilder::appendToCall(call, value);
        return call;
      }
      return ValueBuilder::makeBinary(ret, SET, value);
    }